

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::checkshells(tetgenmesh *this)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  point pdVar11;
  point pdVar12;
  point pdVar13;
  point pdVar14;
  int bakalignbytes;
  int bakpathitemsleft;
  void *bakpathitem;
  void **bakpathblock;
  uint local_88;
  int i;
  int horrors;
  int bakcount;
  point pb;
  point pa;
  face checkseg;
  face nextsh;
  face spinsh;
  face shloop;
  triface symtet;
  triface neightet;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&symtet.ver);
  triface::triface((triface *)&shloop.shver);
  face::face((face *)&spinsh.shver);
  face::face((face *)&nextsh.shver);
  face::face((face *)&checkseg.shver);
  face::face((face *)&pa);
  if (this->b->quiet == 0) {
    printf("  Checking consistency of the mesh boundary...\n");
  }
  local_88 = 0;
  ppvVar3 = this->subfaces->pathblock;
  pvVar4 = this->subfaces->pathitem;
  iVar1 = this->subfaces->pathitemsleft;
  iVar2 = this->subfaces->alignbytes;
  memorypool::traversalinit(this->subfaces);
  spinsh._8_8_ = shellfacetraverse(this,this->subfaces);
  do {
    if (spinsh._8_8_ == 0) {
      if (local_88 == 0) {
        if (this->b->quiet == 0) {
          printf("  Mesh boundaries connected correctly.\n");
        }
      }
      else {
        printf("  !! !! !! !! %d boundary connection viewed with horror.\n",(ulong)local_88);
      }
      this->subfaces->pathblock = ppvVar3;
      this->subfaces->pathitem = pvVar4;
      this->subfaces->pathitemsleft = iVar1;
      this->subfaces->alignbytes = iVar2;
      return local_88;
    }
    shloop.sh._0_4_ = 0;
    for (bakpathblock._4_4_ = 0; uVar10 = local_88, bakpathblock._4_4_ < 3;
        bakpathblock._4_4_ = bakpathblock._4_4_ + 1) {
      pdVar11 = sorg(this,(face *)&spinsh.shver);
      pdVar12 = sdest(this,(face *)&spinsh.shver);
      face::operator=((face *)&nextsh.shver,(face *)&spinsh.shver);
      spivot(this,(face *)&nextsh.shver,(face *)&checkseg.shver);
      while (checkseg._8_8_ != 0 && checkseg._8_8_ != spinsh._8_8_) {
        if (*(long *)(checkseg._8_8_ + 0x18) == 0) {
          printf("  !! !! Wrong subface-subface connection (Dead subface).\n");
          uVar5 = nextsh._8_8_;
          pdVar14 = sorg(this,(face *)&nextsh.shver);
          uVar7 = pointmark(this,pdVar14);
          pdVar14 = sdest(this,(face *)&nextsh.shver);
          uVar8 = pointmark(this,pdVar14);
          pdVar14 = sapex(this,(face *)&nextsh.shver);
          uVar9 = pointmark(this,pdVar14);
          printf("    First: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
          printf("    Second: x%lx (DEAD)\n",checkseg._8_8_);
          local_88 = local_88 + 1;
          break;
        }
        pdVar14 = sorg(this,(face *)&checkseg.shver);
        if (((pdVar14 != pdVar11) ||
            (pdVar14 = sdest(this,(face *)&checkseg.shver), pdVar14 != pdVar12)) &&
           ((pdVar14 = sorg(this,(face *)&checkseg.shver), pdVar14 != pdVar12 ||
            (pdVar14 = sdest(this,(face *)&checkseg.shver), pdVar14 != pdVar11)))) {
          printf("  !! !! Wrong subface-subface connection.\n");
          uVar5 = nextsh._8_8_;
          pdVar14 = sorg(this,(face *)&nextsh.shver);
          uVar7 = pointmark(this,pdVar14);
          pdVar14 = sdest(this,(face *)&nextsh.shver);
          uVar8 = pointmark(this,pdVar14);
          pdVar14 = sapex(this,(face *)&nextsh.shver);
          uVar9 = pointmark(this,pdVar14);
          printf("    First: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
          uVar5 = checkseg._8_8_;
          pdVar14 = sorg(this,(face *)&checkseg.shver);
          uVar7 = pointmark(this,pdVar14);
          pdVar14 = sdest(this,(face *)&checkseg.shver);
          uVar8 = pointmark(this,pdVar14);
          pdVar14 = sapex(this,(face *)&checkseg.shver);
          uVar9 = pointmark(this,pdVar14);
          printf("    Scond: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
          local_88 = local_88 + 1;
          break;
        }
        pdVar14 = sapex(this,(face *)&checkseg.shver);
        pdVar13 = sapex(this,(face *)&nextsh.shver);
        if (pdVar14 == pdVar13) {
          printf("  !! !! Existing two duplicated subfaces.\n");
          uVar5 = nextsh._8_8_;
          pdVar14 = sorg(this,(face *)&nextsh.shver);
          uVar7 = pointmark(this,pdVar14);
          pdVar14 = sdest(this,(face *)&nextsh.shver);
          uVar8 = pointmark(this,pdVar14);
          pdVar14 = sapex(this,(face *)&nextsh.shver);
          uVar9 = pointmark(this,pdVar14);
          printf("    First: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
          uVar5 = checkseg._8_8_;
          pdVar14 = sorg(this,(face *)&checkseg.shver);
          uVar7 = pointmark(this,pdVar14);
          pdVar14 = sdest(this,(face *)&checkseg.shver);
          uVar8 = pointmark(this,pdVar14);
          pdVar14 = sapex(this,(face *)&checkseg.shver);
          uVar9 = pointmark(this,pdVar14);
          printf("    Scond: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
          local_88 = local_88 + 1;
          break;
        }
        face::operator=((face *)&nextsh.shver,(face *)&checkseg.shver);
        spivot(this,(face *)&nextsh.shver,(face *)&checkseg.shver);
      }
      sspivot(this,(face *)&spinsh.shver,(face *)&pa);
      if (pa != (point)0x0) {
        if (pa[3] == 0.0) {
          printf("  !! !! Wrong subface-subseg connection (Dead subseg).\n");
          uVar5 = spinsh._8_8_;
          pdVar11 = sorg(this,(face *)&spinsh.shver);
          uVar7 = pointmark(this,pdVar11);
          pdVar11 = sdest(this,(face *)&spinsh.shver);
          uVar8 = pointmark(this,pdVar11);
          pdVar11 = sapex(this,(face *)&spinsh.shver);
          uVar9 = pointmark(this,pdVar11);
          printf("    Sub: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
          printf("    Sub: x%lx (Dead)\n",pa);
          local_88 = local_88 + 1;
        }
        else {
          pdVar14 = sorg(this,(face *)&pa);
          if (((pdVar14 != pdVar11) || (pdVar14 = sdest(this,(face *)&pa), pdVar14 != pdVar12)) &&
             ((pdVar14 = sorg(this,(face *)&pa), pdVar14 != pdVar12 ||
              (pdVar12 = sdest(this,(face *)&pa), pdVar12 != pdVar11)))) {
            printf("  !! !! Wrong subface-subseg connection.\n");
            uVar5 = spinsh._8_8_;
            pdVar11 = sorg(this,(face *)&spinsh.shver);
            uVar7 = pointmark(this,pdVar11);
            pdVar11 = sdest(this,(face *)&spinsh.shver);
            uVar8 = pointmark(this,pdVar11);
            pdVar11 = sapex(this,(face *)&spinsh.shver);
            uVar9 = pointmark(this,pdVar11);
            printf("    Sub: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
            pdVar11 = pa;
            pdVar12 = sorg(this,(face *)&pa);
            uVar7 = pointmark(this,pdVar12);
            pdVar12 = sdest(this,(face *)&pa);
            uVar8 = pointmark(this,pdVar12);
            printf("    Seg: x%lx (%d, %d).\n",pdVar11,(ulong)uVar7,(ulong)uVar8);
            local_88 = local_88 + 1;
          }
        }
      }
      if ((int)uVar10 < (int)local_88) break;
      senextself(this,(face *)&spinsh.shver);
    }
    stpivot(this,(face *)&spinsh.shver,(triface *)&symtet.ver);
    if (symtet._8_8_ != 0) {
      if (*(long *)(symtet._8_8_ + 0x20) == 0) {
        printf("  !! !! Wrong sub-to-tet connection (Dead tet)\n");
        uVar5 = spinsh._8_8_;
        pdVar11 = sorg(this,(face *)&spinsh.shver);
        uVar10 = pointmark(this,pdVar11);
        pdVar11 = sdest(this,(face *)&spinsh.shver);
        uVar7 = pointmark(this,pdVar11);
        pdVar11 = sapex(this,(face *)&spinsh.shver);
        uVar8 = pointmark(this,pdVar11);
        printf("    Sub: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar10,(ulong)uVar7,(ulong)uVar8);
        printf("    Tet: x%lx (DEAD)\n",symtet._8_8_);
        local_88 = local_88 + 1;
      }
      else {
        pdVar11 = sorg(this,(face *)&spinsh.shver);
        pdVar12 = org(this,(triface *)&symtet.ver);
        if (pdVar11 == pdVar12) {
          pdVar11 = sdest(this,(face *)&spinsh.shver);
          pdVar12 = dest(this,(triface *)&symtet.ver);
          if (pdVar11 != pdVar12) goto LAB_0017046b;
        }
        else {
LAB_0017046b:
          printf("  !! !! Wrong sub-to-tet connection\n");
          uVar5 = spinsh._8_8_;
          pdVar11 = sorg(this,(face *)&spinsh.shver);
          uVar10 = pointmark(this,pdVar11);
          pdVar11 = sdest(this,(face *)&spinsh.shver);
          uVar7 = pointmark(this,pdVar11);
          pdVar11 = sapex(this,(face *)&spinsh.shver);
          uVar8 = pointmark(this,pdVar11);
          printf("    Sub: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar10,(ulong)uVar7,(ulong)uVar8);
          uVar5 = symtet._8_8_;
          pdVar11 = org(this,(triface *)&symtet.ver);
          uVar10 = pointmark(this,pdVar11);
          pdVar11 = dest(this,(triface *)&symtet.ver);
          uVar7 = pointmark(this,pdVar11);
          pdVar11 = apex(this,(triface *)&symtet.ver);
          uVar8 = pointmark(this,pdVar11);
          pdVar11 = oppo(this,(triface *)&symtet.ver);
          uVar9 = pointmark(this,pdVar11);
          printf("    Tet: x%lx (%d, %d, %d, %d).\n",uVar5,(ulong)uVar10,(ulong)uVar7,(ulong)uVar8,
                 (ulong)uVar9);
          local_88 = local_88 + 1;
        }
        tspivot(this,(triface *)&symtet.ver,(face *)&nextsh.shver);
        pdVar11 = sorg(this,(face *)&nextsh.shver);
        pdVar12 = org(this,(triface *)&symtet.ver);
        if (pdVar11 == pdVar12) {
          pdVar11 = sdest(this,(face *)&nextsh.shver);
          pdVar12 = dest(this,(triface *)&symtet.ver);
          if (pdVar11 != pdVar12) goto LAB_00170662;
        }
        else {
LAB_00170662:
          printf("  !! !! Wrong tet-sub connection.\n");
          uVar5 = nextsh._8_8_;
          pdVar11 = sorg(this,(face *)&nextsh.shver);
          uVar10 = pointmark(this,pdVar11);
          pdVar11 = sdest(this,(face *)&nextsh.shver);
          uVar7 = pointmark(this,pdVar11);
          pdVar11 = sapex(this,(face *)&nextsh.shver);
          uVar8 = pointmark(this,pdVar11);
          printf("    Sub: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar10,(ulong)uVar7,(ulong)uVar8);
          uVar5 = symtet._8_8_;
          pdVar11 = org(this,(triface *)&symtet.ver);
          uVar10 = pointmark(this,pdVar11);
          pdVar11 = dest(this,(triface *)&symtet.ver);
          uVar7 = pointmark(this,pdVar11);
          pdVar11 = apex(this,(triface *)&symtet.ver);
          uVar8 = pointmark(this,pdVar11);
          pdVar11 = oppo(this,(triface *)&symtet.ver);
          uVar9 = pointmark(this,pdVar11);
          printf("    Tet: x%lx (%d, %d, %d, %d).\n",uVar5,(ulong)uVar10,(ulong)uVar7,(ulong)uVar8,
                 (ulong)uVar9);
          local_88 = local_88 + 1;
        }
        fsym(this,(triface *)&symtet.ver,(triface *)&shloop.shver);
        tspivot(this,(triface *)&shloop.shver,(face *)&nextsh.shver);
        if (nextsh._8_8_ == 0) {
          printf("  Warning: Broken tet-sub-tet connection.\n");
        }
        else {
          pdVar11 = sorg(this,(face *)&nextsh.shver);
          pdVar12 = org(this,(triface *)&shloop.shver);
          if (pdVar11 == pdVar12) {
            pdVar11 = sdest(this,(face *)&nextsh.shver);
            pdVar12 = dest(this,(triface *)&shloop.shver);
            if (pdVar11 == pdVar12) goto LAB_001709ff;
          }
          printf("  !! !! Wrong tet-sub connection.\n");
          uVar5 = nextsh._8_8_;
          pdVar11 = sorg(this,(face *)&nextsh.shver);
          uVar10 = pointmark(this,pdVar11);
          pdVar11 = sdest(this,(face *)&nextsh.shver);
          uVar7 = pointmark(this,pdVar11);
          pdVar11 = sapex(this,(face *)&nextsh.shver);
          uVar8 = pointmark(this,pdVar11);
          printf("    Sub: x%lx (%d, %d, %d).\n",uVar5,(ulong)uVar10,(ulong)uVar7,(ulong)uVar8);
          uVar5 = shloop._8_8_;
          pdVar11 = org(this,(triface *)&shloop.shver);
          uVar10 = pointmark(this,pdVar11);
          pdVar11 = dest(this,(triface *)&shloop.shver);
          uVar7 = pointmark(this,pdVar11);
          pdVar11 = apex(this,(triface *)&shloop.shver);
          uVar8 = pointmark(this,pdVar11);
          pdVar11 = oppo(this,(triface *)&shloop.shver);
          uVar9 = pointmark(this,pdVar11);
          printf("    Tet: x%lx (%d, %d, %d, %d).\n",uVar5,(ulong)uVar10,(ulong)uVar7,(ulong)uVar8,
                 (ulong)uVar9);
          local_88 = local_88 + 1;
        }
      }
    }
LAB_001709ff:
    bVar6 = sinfected(this,(face *)&spinsh.shver);
    if (bVar6) {
      pdVar11 = sorg(this,(face *)&spinsh.shver);
      uVar10 = pointmark(this,pdVar11);
      pdVar11 = sdest(this,(face *)&spinsh.shver);
      uVar7 = pointmark(this,pdVar11);
      pdVar11 = sapex(this,(face *)&spinsh.shver);
      uVar8 = pointmark(this,pdVar11);
      printf("  !! A infected subface: (%d, %d, %d).\n",(ulong)uVar10,(ulong)uVar7,(ulong)uVar8);
    }
    bVar6 = smarktested(this,(face *)&spinsh.shver);
    if (bVar6) {
      pdVar11 = sorg(this,(face *)&spinsh.shver);
      uVar10 = pointmark(this,pdVar11);
      pdVar11 = sdest(this,(face *)&spinsh.shver);
      uVar7 = pointmark(this,pdVar11);
      pdVar11 = sapex(this,(face *)&spinsh.shver);
      uVar8 = pointmark(this,pdVar11);
      printf("  !! A marked subface: (%d, %d, %d).\n",(ulong)uVar10,(ulong)uVar7,(ulong)uVar8);
    }
    spinsh._8_8_ = shellfacetraverse(this,this->subfaces);
  } while( true );
}

Assistant:

int tetgenmesh::checkshells()
{
  triface neightet, symtet;
  face shloop, spinsh, nextsh;
  face checkseg;
  point pa, pb;
  int bakcount;
  int horrors, i;

  if (!b->quiet) {
    printf("  Checking consistency of the mesh boundary...\n");
  }
  horrors = 0;

  void **bakpathblock = subfaces->pathblock;
  void *bakpathitem = subfaces->pathitem;
  int bakpathitemsleft = subfaces->pathitemsleft;
  int bakalignbytes = subfaces->alignbytes;

  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  while (shloop.sh != NULL) {
    shloop.shver = 0;
    for (i = 0; i < 3; i++) {
      // Check the face ring at this edge.
      pa = sorg(shloop);
      pb = sdest(shloop);
      spinsh = shloop;
      spivot(spinsh, nextsh);
      bakcount = horrors;
      while ((nextsh.sh != NULL) && (nextsh.sh != shloop.sh)) {
        if (nextsh.sh[3] == NULL) {
          printf("  !! !! Wrong subface-subface connection (Dead subface).\n");
          printf("    First: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                 pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                 pointmark(sapex(spinsh)));
          printf("    Second: x%lx (DEAD)\n", (uintptr_t) nextsh.sh);
          horrors++;
          break;
        }
        // check if they have the same edge.
        if (!(((sorg(nextsh) == pa) && (sdest(nextsh) == pb)) ||
              ((sorg(nextsh) == pb) && (sdest(nextsh) == pa)))) {
           printf("  !! !! Wrong subface-subface connection.\n");
           printf("    First: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                  pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                  pointmark(sapex(spinsh)));
           printf("    Scond: x%lx (%d, %d, %d).\n", (uintptr_t) nextsh.sh,
                  pointmark(sorg(nextsh)), pointmark(sdest(nextsh)), 
                  pointmark(sapex(nextsh)));
           horrors++;
           break;
        }
        // Check they should not have the same apex.
        if (sapex(nextsh) == sapex(spinsh)) {
           printf("  !! !! Existing two duplicated subfaces.\n");
           printf("    First: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                  pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                  pointmark(sapex(spinsh)));
           printf("    Scond: x%lx (%d, %d, %d).\n", (uintptr_t) nextsh.sh,
                  pointmark(sorg(nextsh)), pointmark(sdest(nextsh)), 
                  pointmark(sapex(nextsh)));
           horrors++;
           break;
        }
        spinsh = nextsh;
        spivot(spinsh, nextsh);
      }
      // Check subface-subseg bond.
      sspivot(shloop, checkseg);
      if (checkseg.sh != NULL) {
        if (checkseg.sh[3] == NULL) {
          printf("  !! !! Wrong subface-subseg connection (Dead subseg).\n");
          printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
                 pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
                 pointmark(sapex(shloop)));
          printf("    Sub: x%lx (Dead)\n", (uintptr_t) checkseg.sh);
          horrors++;
        } else {
          if (!(((sorg(checkseg) == pa) && (sdest(checkseg) == pb)) ||
                ((sorg(checkseg) == pb) && (sdest(checkseg) == pa)))) {
            printf("  !! !! Wrong subface-subseg connection.\n");
            printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
                   pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
                   pointmark(sapex(shloop)));
            printf("    Seg: x%lx (%d, %d).\n", (uintptr_t) checkseg.sh,
                   pointmark(sorg(checkseg)), pointmark(sdest(checkseg)));
            horrors++;
          }
        }
      }
      if (horrors > bakcount) break; // An error detected. 
      senextself(shloop);
    }
    // Check tet-subface connection.
    stpivot(shloop, neightet);
    if (neightet.tet != NULL) {
      if (neightet.tet[4] == NULL) {
        printf("  !! !! Wrong sub-to-tet connection (Dead tet)\n");
        printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
               pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
               pointmark(sapex(shloop)));
        printf("    Tet: x%lx (DEAD)\n", (uintptr_t) neightet.tet);
        horrors++;
      } else {
        if (!((sorg(shloop) == org(neightet)) && 
              (sdest(shloop) == dest(neightet)))) {
          printf("  !! !! Wrong sub-to-tet connection\n");
          printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
                 pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
                 pointmark(sapex(shloop)));
          printf("    Tet: x%lx (%d, %d, %d, %d).\n",
                 (uintptr_t) neightet.tet, pointmark(org(neightet)), 
                 pointmark(dest(neightet)), pointmark(apex(neightet)),
                 pointmark(oppo(neightet)));
          horrors++;
        }
        tspivot(neightet, spinsh);
        if (!((sorg(spinsh) == org(neightet)) && 
              (sdest(spinsh) == dest(neightet)))) {
          printf("  !! !! Wrong tet-sub connection.\n");
          printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                 pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                 pointmark(sapex(spinsh)));
          printf("    Tet: x%lx (%d, %d, %d, %d).\n", 
                 (uintptr_t) neightet.tet, pointmark(org(neightet)), 
                 pointmark(dest(neightet)), pointmark(apex(neightet)), 
                 pointmark(oppo(neightet)));
          horrors++;
        }
        fsym(neightet, symtet);
        tspivot(symtet, spinsh);
        if (spinsh.sh != NULL) {
          if (!((sorg(spinsh) == org(symtet)) && 
                (sdest(spinsh) == dest(symtet)))) {
            printf("  !! !! Wrong tet-sub connection.\n");
            printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                   pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                   pointmark(sapex(spinsh)));
            printf("    Tet: x%lx (%d, %d, %d, %d).\n", 
                   (uintptr_t) symtet.tet, pointmark(org(symtet)), 
                   pointmark(dest(symtet)), pointmark(apex(symtet)), 
                   pointmark(oppo(symtet)));
            horrors++;
          }
        } else {
          printf("  Warning: Broken tet-sub-tet connection.\n");
        }
      }
    }
    if (sinfected(shloop)) {
      // This may be a bug. report it.
      printf("  !! A infected subface: (%d, %d, %d).\n", 
             pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
             pointmark(sapex(shloop)));
    }
    if (smarktested(shloop)) {
      // This may be a bug. report it.
      printf("  !! A marked subface: (%d, %d, %d).\n", pointmark(sorg(shloop)), 
             pointmark(sdest(shloop)), pointmark(sapex(shloop)));
    }
    shloop.sh = shellfacetraverse(subfaces);
  }

  if (horrors == 0) {
    if (!b->quiet) {
      printf("  Mesh boundaries connected correctly.\n");
    }
  } else {
    printf("  !! !! !! !! %d boundary connection viewed with horror.\n",
           horrors);
  }

  subfaces->pathblock = bakpathblock;
  subfaces->pathitem = bakpathitem;
  subfaces->pathitemsleft = bakpathitemsleft;
  subfaces->alignbytes = bakalignbytes;

  return horrors;
}